

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpOperations.cpp
# Opt level: O2

pointer __thiscall
gmlc::networking::establishConnection
          (networking *this,SocketFactory *sf,io_context *io_context,string *address,
          milliseconds timeOut)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer pVar1;
  string port;
  string interface;
  string local_c0;
  string local_a0;
  string *local_80;
  string *local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  extractInterfaceAndPortString(&local_70,address);
  local_80 = &local_c0;
  local_78 = &local_a0;
  std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
            ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_80,&local_70);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_70);
  establishConnection(this,sf,io_context,&local_a0,&local_c0,timeOut);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  pVar1.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar1.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (pointer)pVar1.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer establishConnection(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& address,
    std::chrono::milliseconds timeOut)
{
    std::string interface;
    std::string port;
    std::tie(interface, port) = extractInterfaceAndPortString(address);
    return establishConnection(sf, io_context, interface, port, timeOut);
}